

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::LowerInclusiveBetweenOperator,true,true,true>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  long lVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  idx_t iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  
  if (count == 0) {
    iVar16 = 0;
  }
  else {
    psVar1 = result_sel->sel_vector;
    psVar2 = asel->sel_vector;
    psVar3 = bsel->sel_vector;
    psVar4 = csel->sel_vector;
    psVar5 = true_sel->sel_vector;
    psVar6 = false_sel->sel_vector;
    iVar16 = 0;
    lVar15 = 0;
    uVar21 = 0;
    do {
      uVar9 = uVar21;
      if (psVar1 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar1[uVar21];
      }
      uVar10 = uVar21;
      if (psVar2 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar2[uVar21];
      }
      uVar13 = uVar21;
      if (psVar3 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar3[uVar21];
      }
      uVar14 = uVar21;
      if (psVar4 != (sel_t *)0x0) {
        uVar14 = (ulong)psVar4[uVar21];
      }
      lVar18._0_4_ = adata[uVar10].months;
      lVar18._4_4_ = adata[uVar10].days;
      lVar12._0_4_ = bdata[uVar13].months;
      lVar12._4_4_ = bdata[uVar13].days;
      lVar11 = (lVar12 >> 0x20) + bdata[uVar13].micros / 86400000000;
      lVar17 = lVar11 % 0x1e;
      lVar20 = (long)(int)(undefined4)lVar12 + lVar11 / 0x1e;
      lVar12 = (lVar18 >> 0x20) + adata[uVar10].micros / 86400000000;
      lVar19 = adata[uVar10].micros % 86400000000;
      lVar11 = lVar12 % 0x1e;
      lVar18 = (long)(int)(undefined4)lVar18 + lVar12 / 0x1e;
      if (lVar18 < lVar20) {
LAB_003da8dd:
        bVar8 = false;
      }
      else {
        lVar7._0_4_ = cdata[uVar14].months;
        lVar7._4_4_ = cdata[uVar14].days;
        if ((lVar18 <= lVar20) &&
           ((lVar11 < lVar17 ||
            ((lVar11 <= lVar17 && (lVar19 < bdata[uVar13].micros % 86400000000))))))
        goto LAB_003da8dd;
        lVar12 = (lVar7 >> 0x20) + cdata[uVar14].micros / 86400000000;
        lVar17 = (long)(int)(undefined4)lVar7 + lVar12 / 0x1e;
        bVar8 = true;
        if (lVar17 <= lVar18) {
          if (lVar17 < lVar18) {
            bVar8 = false;
          }
          else {
            lVar12 = lVar12 % 0x1e;
            bVar8 = true;
            if (lVar12 <= lVar11) {
              bVar8 = lVar19 < cdata[uVar14].micros % 86400000000 && lVar11 <= lVar12;
            }
          }
        }
      }
      psVar5[iVar16] = (sel_t)uVar9;
      iVar16 = iVar16 + bVar8;
      psVar6[lVar15] = (sel_t)uVar9;
      lVar15 = lVar15 + (ulong)(bVar8 ^ 1);
      uVar21 = uVar21 + 1;
    } while (count != uVar21);
  }
  return iVar16;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}